

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtconcurrentthreadengine.cpp
# Opt level: O1

void __thiscall QtConcurrent::ThreadEngineBase::acquireBarrierSemaphore(ThreadEngineBase *this)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  
  do {
    iVar1 = (this->barrier).count.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
            super___atomic_base<int>._M_i;
    if (iVar1 < 0) {
      iVar2 = iVar1 + -1;
    }
    else {
      iVar2 = iVar1 + 1;
    }
    LOCK();
    bVar3 = iVar1 == (this->barrier).count.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
                     _q_value.super___atomic_base<int>._M_i;
    if (bVar3) {
      (this->barrier).count.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i = iVar2;
    }
    UNLOCK();
  } while (!bVar3);
  return;
}

Assistant:

void ThreadEngineBase::acquireBarrierSemaphore()
{
    barrier.acquire();
}